

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::SourceWrapper<absl::lts_20250127::Cord>::MergeInto<false>
          (SourceWrapper<absl::lts_20250127::Cord> *this,MessageLite *msg,TcParseTableBase *tc_table
          ,ParseFlags parse_flags)

{
  bool bVar1;
  ParseFlags in_R9D;
  string_view input_00;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> flat;
  CordInputStream input;
  _Storage<std::basic_string_view<char,_std::char_traits<char>_>,_true> local_108;
  char local_f8;
  CordInputStream local_f0;
  
  absl::lts_20250127::Cord::TryFlat
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_108._M_value
             ,this->cord);
  if ((local_f8 == '\x01') && ((ulong)local_108._0_8_ < (internal *)0x201)) {
    input_00._M_str = (char *)msg;
    input_00._M_len = (size_t)local_108._M_value._M_str;
    bVar1 = MergeFromImpl<false>
                      ((internal *)local_108._M_value._M_len,input_00,(MessageLite *)tc_table,
                       (TcParseTableBase *)(ulong)parse_flags,in_R9D);
  }
  else {
    io::CordInputStream::CordInputStream(&local_f0,this->cord);
    bVar1 = MergeFromImpl<false>(&local_f0.super_ZeroCopyInputStream,msg,tc_table,parse_flags);
  }
  return bVar1;
}

Assistant:

bool MergeInto(MessageLite* msg, const internal::TcParseTableBase* tc_table,
                 MessageLite::ParseFlags parse_flags) const {
    absl::optional<absl::string_view> flat = cord->TryFlat();
    if (flat && flat->size() <= ParseContext::kMaxCordBytesToCopy) {
      return MergeFromImpl<alias>(*flat, msg, tc_table, parse_flags);
    } else {
      io::CordInputStream input(cord);
      return MergeFromImpl<alias>(&input, msg, tc_table, parse_flags);
    }
  }